

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MergeRowidLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  undefined8 uVar1;
  Fts5Buffer *pFVar2;
  byte bVar3;
  int iVar4;
  u8 *puVar5;
  u8 *puVar6;
  uint uVar7;
  u8 *puVar8;
  int iVar9;
  uint uVar10;
  int i;
  bool bVar11;
  u64 iVal;
  u8 *local_68 [2];
  Fts5Buffer local_58;
  Fts5Buffer *local_48;
  Fts5Buffer *local_40;
  u8 *local_38;
  
  local_58.p = (u8 *)0x0;
  local_58.n = 0;
  local_58.nSpace = 0;
  sqlite3Fts5BufferSize(&p->rc,&local_58,p2->n + p1->n);
  if (p->rc == 0) {
    local_48 = p1;
    if (p1->n < 1) {
      puVar8 = (u8 *)0x0;
      uVar10 = 0xffffffff;
    }
    else {
      bVar3 = sqlite3Fts5GetVarint(p1->p,(u64 *)local_68);
      uVar10 = (uint)bVar3;
      puVar8 = local_68[0];
    }
    local_40 = p2;
    if (p2->n < 1) {
      puVar5 = (u8 *)0x0;
      uVar7 = 0xffffffff;
    }
    else {
      bVar3 = sqlite3Fts5GetVarint(p2->p,(u64 *)local_68);
      uVar7 = (uint)bVar3;
      puVar5 = local_68[0];
    }
    bVar11 = -1 < (int)uVar10;
    if (-1 < (int)(uVar10 & uVar7)) {
      local_38 = local_58.p;
      puVar6 = (u8 *)0x0;
      iVar9 = local_58.n;
      do {
        if ((bVar11) && (((int)uVar7 < 0 || ((long)puVar8 < (long)puVar5)))) {
          iVar4 = sqlite3Fts5PutVarint(local_38 + iVar9,(long)puVar8 - (long)puVar6);
          puVar6 = puVar8;
          if ((int)uVar10 < local_48->n) {
            bVar3 = sqlite3Fts5GetVarint(local_48->p + uVar10,(u64 *)local_68);
            uVar10 = uVar10 + bVar3;
            puVar8 = local_68[0] + (long)puVar8;
          }
          else {
            uVar10 = 0xffffffff;
          }
        }
        else {
          iVar4 = sqlite3Fts5PutVarint(local_38 + iVar9,(long)puVar5 - (long)puVar6);
          pFVar2 = local_40;
          if ((bool)(bVar11 & puVar8 == puVar5)) {
            if ((int)uVar10 < local_48->n) {
              bVar3 = sqlite3Fts5GetVarint(local_48->p + uVar10,(u64 *)local_68);
              uVar10 = uVar10 + bVar3;
              puVar8 = puVar8 + (long)local_68[0];
            }
            else {
              uVar10 = 0xffffffff;
            }
          }
          puVar6 = puVar5;
          if ((int)uVar7 < pFVar2->n) {
            bVar3 = sqlite3Fts5GetVarint(pFVar2->p + (int)uVar7,(u64 *)local_68);
            uVar7 = uVar7 + bVar3;
            puVar5 = local_68[0] + (long)puVar5;
          }
          else {
            uVar7 = 0xffffffff;
          }
        }
        iVar9 = iVar4 + iVar9;
        bVar11 = -1 < (int)uVar10;
      } while ((bVar11) || (-1 < (int)uVar7));
      local_58.n = iVar9;
    }
    local_68[0] = local_58.p;
    local_68[1] = (u8 *)local_58._8_8_;
    puVar8 = local_48->p;
    uVar1._0_4_ = local_48->n;
    uVar1._4_4_ = local_48->nSpace;
    local_48->p = local_58.p;
    local_48->n = local_58.n;
    local_48->nSpace = local_58.nSpace;
    local_58.p = puVar8;
    local_58._8_8_ = uVar1;
    sqlite3_free(puVar8);
  }
  return;
}

Assistant:

static void fts5MergeRowidLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  int i1 = 0;
  int i2 = 0;
  i64 iRowid1 = 0;
  i64 iRowid2 = 0;
  i64 iOut = 0;

  Fts5Buffer out;
  memset(&out, 0, sizeof(out));
  sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n);
  if( p->rc ) return;

  fts5NextRowid(p1, &i1, &iRowid1);
  fts5NextRowid(p2, &i2, &iRowid2);
  while( i1>=0 || i2>=0 ){
    if( i1>=0 && (i2<0 || iRowid1<iRowid2) ){
      assert( iOut==0 || iRowid1>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid1 - iOut);
      iOut = iRowid1;
      fts5NextRowid(p1, &i1, &iRowid1);
    }else{
      assert( iOut==0 || iRowid2>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid2 - iOut);
      iOut = iRowid2;
      if( i1>=0 && iRowid1==iRowid2 ){
        fts5NextRowid(p1, &i1, &iRowid1);
      }
      fts5NextRowid(p2, &i2, &iRowid2);
    }
  }

  fts5BufferSwap(&out, p1);
  fts5BufferFree(&out);
}